

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
               (interval_t *ldata,interval_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  sel_t *psVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  long lVar11;
  idx_t idx_in_entry;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = lsel->sel_vector;
      psVar2 = rsel->sel_vector;
      uVar16 = 0;
      do {
        uVar8 = uVar16;
        if (psVar1 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar1[uVar16];
        }
        uVar14 = uVar16;
        if (psVar2 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar2[uVar16];
        }
        lVar17._0_4_ = ldata[uVar8].months;
        lVar17._4_4_ = ldata[uVar8].days;
        lVar13._0_4_ = rdata[uVar14].months;
        lVar13._4_4_ = rdata[uVar14].days;
        lVar12 = (lVar17 >> 0x20) + ldata[uVar8].micros / 86400000000;
        lVar11 = (long)(int)(undefined4)lVar17 + lVar12 / 0x1e;
        lVar15 = (lVar13 >> 0x20) + rdata[uVar14].micros / 86400000000;
        lVar17 = (long)(int)(undefined4)lVar13 + lVar15 / 0x1e;
        bVar7 = true;
        if (lVar11 <= lVar17) {
          if (lVar11 < lVar17) {
            bVar7 = false;
          }
          else {
            lVar12 = lVar12 % 0x1e;
            lVar15 = lVar15 % 0x1e;
            if (lVar12 <= lVar15) {
              bVar7 = rdata[uVar14].micros % 86400000000 < ldata[uVar8].micros % 86400000000 &&
                      lVar15 <= lVar12;
            }
          }
        }
        result_data[uVar16] = bVar7;
        uVar16 = uVar16 + 1;
      } while (count != uVar16);
    }
  }
  else if (count != 0) {
    psVar1 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar16 = 0;
    do {
      uVar8 = uVar16;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[uVar16];
      }
      uVar14 = uVar16;
      if (psVar2 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar2[uVar16];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) &&
         ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)))) {
        lVar15._0_4_ = ldata[uVar8].months;
        lVar15._4_4_ = ldata[uVar8].days;
        lVar11._0_4_ = rdata[uVar14].months;
        lVar11._4_4_ = rdata[uVar14].days;
        lVar13 = (lVar15 >> 0x20) + ldata[uVar8].micros / 86400000000;
        lVar17 = (long)(int)(undefined4)lVar15 + lVar13 / 0x1e;
        lVar15 = (lVar11 >> 0x20) + rdata[uVar14].micros / 86400000000;
        lVar11 = (long)(int)(undefined4)lVar11 + lVar15 / 0x1e;
        bVar7 = true;
        if (lVar17 <= lVar11) {
          if (lVar17 < lVar11) {
            bVar7 = false;
          }
          else {
            lVar13 = lVar13 % 0x1e;
            lVar15 = lVar15 % 0x1e;
            if (lVar13 <= lVar15) {
              bVar7 = rdata[uVar14].micros % 86400000000 < ldata[uVar8].micros % 86400000000 &&
                      lVar15 <= lVar13;
            }
          }
        }
        result_data[uVar16] = bVar7;
      }
      else {
        _Var10._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var10._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var6 = p_Stack_50;
          peVar5 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          _Var10._M_head_impl =
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var10._M_head_impl;
        }
        bVar4 = (byte)uVar16 & 0x3f;
        _Var10._M_head_impl[uVar16 >> 6] =
             _Var10._M_head_impl[uVar16 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4)
        ;
      }
      uVar16 = uVar16 + 1;
    } while (count != uVar16);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}